

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::ImageDataParameter::InternalSwap(ImageDataParameter *this,ImageDataParameter *other)

{
  InternalMetadataWithArena *this_00;
  ImageDataParameter *other_local;
  ImageDataParameter *this_local;
  Container *local_30;
  
  std::swap<std::__cxx11::string*>(&(this->source_).ptr_,&(other->source_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->mean_file_).ptr_,&(other->mean_file_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->root_folder_).ptr_,&(other->root_folder_).ptr_);
  std::swap<unsigned_int>(&this->crop_size_,&other->crop_size_);
  std::swap<unsigned_int>(&this->rand_skip_,&other->rand_skip_);
  std::swap<bool>(&this->shuffle_,&other->shuffle_);
  std::swap<bool>(&this->mirror_,&other->mirror_);
  std::swap<unsigned_int>(&this->new_height_,&other->new_height_);
  std::swap<unsigned_int>(&this->new_width_,&other->new_width_);
  std::swap<bool>(&this->is_color_,&other->is_color_);
  std::swap<float>(&this->scale_,&other->scale_);
  std::swap<unsigned_int>(&this->batch_size_,&other->batch_size_);
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  this_00 = &other->_internal_metadata_;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) != 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) != 1) goto LAB_00795f58;
  }
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                           *)this_00);
  }
  else {
    local_30 = (Container *)
               google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap
            (&this->_internal_metadata_,&local_30->unknown_fields);
LAB_00795f58:
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void ImageDataParameter::InternalSwap(ImageDataParameter* other) {
  source_.Swap(&other->source_);
  mean_file_.Swap(&other->mean_file_);
  root_folder_.Swap(&other->root_folder_);
  std::swap(crop_size_, other->crop_size_);
  std::swap(rand_skip_, other->rand_skip_);
  std::swap(shuffle_, other->shuffle_);
  std::swap(mirror_, other->mirror_);
  std::swap(new_height_, other->new_height_);
  std::swap(new_width_, other->new_width_);
  std::swap(is_color_, other->is_color_);
  std::swap(scale_, other->scale_);
  std::swap(batch_size_, other->batch_size_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}